

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_ray_hit_info *
rf_collision_ray_ground(rf_ray_hit_info *__return_storage_ptr__,rf_ray ray,float ground_height)

{
  float scale;
  rf_vec3 rVar1;
  undefined8 local_88;
  float local_80;
  float distance;
  float ground_height_local;
  
  memset(__return_storage_ptr__,0,0x20);
  if (1e-06 < ABS(ray.direction.y)) {
    scale = (ray.position.y - ground_height) / -ray.direction.y;
    if (0.0 <= scale) {
      __return_storage_ptr__->hit = true;
      __return_storage_ptr__->distance = scale;
      (__return_storage_ptr__->normal).z = 0.0;
      (__return_storage_ptr__->normal).x = 0.0;
      (__return_storage_ptr__->normal).y = 1.0;
      rVar1 = rf_vec3_scale(ray.direction,scale);
      rVar1 = rf_vec3_add(ray.position,rVar1);
      local_88 = rVar1._0_8_;
      local_80 = rVar1.z;
      (__return_storage_ptr__->position).x = (float)(undefined4)local_88;
      (__return_storage_ptr__->position).y = (float)local_88._4_4_;
      (__return_storage_ptr__->position).z = local_80;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_ray_hit_info rf_collision_ray_ground(rf_ray ray, float ground_height)
{
#define rf_epsilon 0.000001 // Just a small number

    rf_ray_hit_info result = {0};

    if (fabs(ray.direction.y) > rf_epsilon)
    {
        float distance = (ray.position.y - ground_height) / -ray.direction.y;

        if (distance >= 0.0)
        {
            result.hit = true;
            result.distance = distance;
            result.normal = (rf_vec3) {0.0, 1.0, 0.0};
            result.position = rf_vec3_add(ray.position, rf_vec3_scale(ray.direction, distance));
        }
    }

    return result;
}